

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O1

int64_t __thiscall libtorrent::bdecode_node::int_value(bdecode_node *this)

{
  char *pcVar1;
  int64_t iVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  byte *pbVar6;
  long lVar7;
  ulong uVar8;
  
  pcVar1 = this->m_buffer;
  uVar5 = (ulong)this->m_root_tokens[this->m_token_idx] & 0x1fffffff;
  pbVar6 = (byte *)(pcVar1 + (pcVar1[uVar5 + 1] == '-') + uVar5);
  lVar3 = 0;
  iVar4 = 0;
  do {
    pbVar6 = pbVar6 + 1;
    if (pcVar1 + ((ulong)this->m_root_tokens[(long)this->m_token_idx + 1] & 0x1fffffff) + 1 <=
        pbVar6) goto LAB_0018dbce;
    uVar8 = (ulong)*pbVar6;
    if (uVar8 == 0x65) goto LAB_0018dbce;
    if ((0xccccccccccccccc < lVar3) || ((byte)(*pbVar6 - 0x3a) < 0xf6)) {
      iVar4 = 1;
      goto LAB_0018dbce;
    }
    lVar7 = lVar3 * 10;
    lVar3 = uVar8 + lVar7 + -0x30;
  } while (lVar7 <= (long)(-0x7fffffffffffffd1 - uVar8));
  iVar4 = 7;
  lVar3 = lVar7;
LAB_0018dbce:
  lVar7 = -lVar3;
  if (pcVar1[uVar5 + 1] != '-') {
    lVar7 = lVar3;
  }
  iVar2 = 0;
  if (iVar4 == 0) {
    iVar2 = lVar7;
  }
  return iVar2;
}

Assistant:

std::int64_t bdecode_node::int_value() const
	{
		TORRENT_ASSERT(type() == int_t);
		bdecode_token const& t = m_root_tokens[m_token_idx];
		int const size = token_source_span(t);
		TORRENT_ASSERT(t.type == bdecode_token::integer);

		// +1 is to skip the 'i'
		char const* ptr = m_buffer + t.offset + 1;
		std::int64_t val = 0;
		bool const negative = (*ptr == '-');
		bdecode_errors::error_code_enum ec = bdecode_errors::no_error;
		char const* end = parse_int(ptr + int(negative)
			, ptr + size, 'e', val, ec);
		if (ec) return 0;
		TORRENT_UNUSED(end);
		TORRENT_ASSERT(end < ptr + size);
		if (negative) val = -val;
		return val;
	}